

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

int duckdb_lz4::LZ4_loadDict(LZ4_stream_t *LZ4_dict,char *dictionary,int dictSize)

{
  long *plVar1;
  int iVar2;
  U32 *hashTable;
  ulong uVar3;
  LZ4_u32 LVar4;
  
  LVar4 = 0;
  memset(LZ4_dict,0,0x4020);
  (LZ4_dict->internal_donotuse).currentOffset = 0x10000;
  if (7 < dictSize) {
    uVar3 = (ulong)(uint)dictSize;
    plVar1 = (long *)(dictionary + (uVar3 - 0x10000));
    if ((uint)dictSize < 0x10001) {
      plVar1 = (long *)dictionary;
    }
    (LZ4_dict->internal_donotuse).dictionary = (LZ4_byte *)plVar1;
    LVar4 = ((int)dictionary + dictSize) - (int)plVar1;
    (LZ4_dict->internal_donotuse).dictSize = LVar4;
    (LZ4_dict->internal_donotuse).tableType = 2;
    iVar2 = 0x10000;
    if (0x10000 < uVar3) {
      iVar2 = dictSize;
    }
    iVar2 = iVar2 - dictSize;
    for (; plVar1 <= dictionary + (uVar3 - 8); plVar1 = (long *)((long)plVar1 + 3)) {
      *(int *)((long)LZ4_dict + ((ulong)(*plVar1 * -0x30e4432345000000) >> 0x34) * 4) = iVar2;
      iVar2 = iVar2 + 3;
    }
  }
  return LVar4;
}

Assistant:

int LZ4_loadDict (LZ4_stream_t* LZ4_dict, const char* dictionary, int dictSize)
{
    LZ4_stream_t_internal* dict = &LZ4_dict->internal_donotuse;
    const tableType_t tableType = byU32;
    const BYTE* p = (const BYTE*)dictionary;
    const BYTE* const dictEnd = p + dictSize;
    const BYTE* base;

    DEBUGLOG(4, "LZ4_loadDict (%i bytes from %p into %p)", dictSize, dictionary, LZ4_dict);

    /* It's necessary to reset the context,
     * and not just continue it with prepareTable()
     * to avoid any risk of generating overflowing matchIndex
     * when compressing using this dictionary */
    LZ4_resetStream(LZ4_dict);

    /* We always increment the offset by 64 KB, since, if the dict is longer,
     * we truncate it to the last 64k, and if it's shorter, we still want to
     * advance by a whole window length so we can provide the guarantee that
     * there are only valid offsets in the window, which allows an optimization
     * in LZ4_compress_fast_continue() where it uses noDictIssue even when the
     * dictionary isn't a full 64k. */
    dict->currentOffset += 64 KB;

    if (dictSize < (int)HASH_UNIT) {
        return 0;
    }

    if ((dictEnd - p) > 64 KB) p = dictEnd - 64 KB;
    base = dictEnd - dict->currentOffset;
    dict->dictionary = p;
    dict->dictSize = (U32)(dictEnd - p);
    dict->tableType = (U32)tableType;

    while (p <= dictEnd-HASH_UNIT) {
        LZ4_putPosition(p, dict->hashTable, tableType, base);
        p+=3;
    }

    return (int)dict->dictSize;
}